

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce_sockets.cc
# Opt level: O0

socket_t sock_connect(uint32_t ip,int port)

{
  uint16_t uVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  ostream *poVar5;
  undefined8 uVar6;
  vw_exception *this;
  void *this_00;
  uint16_t in_SI;
  undefined4 in_EDI;
  stringstream __msg_3;
  stringstream msg;
  int ret;
  size_t count;
  char __errmsg_2 [256];
  stringstream __msg_2;
  char servInfo [32];
  char hostname [1025];
  char __errmsg_1 [256];
  stringstream __msg_1;
  char dotted_quad [16];
  sockaddr_in far_end;
  char __errmsg [256];
  stringstream __msg;
  socket_t sock;
  string *in_stack_ffffffffffffefa8;
  ostream *in_stack_ffffffffffffefb0;
  int plineNumber;
  undefined7 in_stack_ffffffffffffefb8;
  undefined1 in_stack_ffffffffffffefbf;
  undefined1 uVar7;
  vw_exception *in_stack_ffffffffffffefc0;
  stringstream local_fd0 [16];
  ostream local_fc0;
  string local_e48 [32];
  stringstream local_e28 [16];
  ostream local_e18;
  int local_c9c;
  ulong local_c98;
  undefined1 local_c89;
  char local_c68 [264];
  stringstream local_b60 [16];
  ostream local_b50;
  char local_9d8 [32];
  char local_9b8 [1039];
  undefined1 local_5a9;
  char local_588 [264];
  stringstream local_480 [16];
  ostream local_470;
  char local_2f8 [28];
  sockaddr local_2dc;
  undefined1 local_2c9;
  char local_2a8 [272];
  stringstream local_198 [16];
  ostream local_188;
  int local_c;
  uint16_t local_8;
  char local_4 [4];
  
  local_4 = (char  [4])in_EDI;
  local_8 = in_SI;
  local_c = socket(2,1,0);
  iVar2 = (int)((ulong)in_stack_ffffffffffffefb0 >> 0x20);
  if (local_c == -1) {
    std::__cxx11::stringstream::stringstream(local_198);
    std::operator<<(&local_188,"socket");
    piVar3 = __errno_location();
    pcVar4 = strerror_r(*piVar3,local_2a8,0x100);
    if (pcVar4 == (char *)0x0) {
      poVar5 = std::operator<<(&local_188,"errno = ");
      std::operator<<(poVar5,local_2a8);
    }
    else {
      std::operator<<(&local_188,"errno = unknown");
    }
    local_2c9 = 1;
    uVar6 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_ffffffffffffefc0,
               (char *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),iVar2,
               in_stack_ffffffffffffefa8);
    local_2c9 = 0;
    __cxa_throw(uVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  local_2dc.sa_family = 2;
  local_2dc.sa_data[2] = local_4[0];
  local_2dc.sa_data[3] = local_4[1];
  local_2dc.sa_data[4] = local_4[2];
  local_2dc.sa_data[5] = local_4[3];
  memset(local_2dc.sa_data + 6,0,8);
  pcVar4 = inet_ntop(2,local_2dc.sa_data + 2,local_2f8,0x10);
  iVar2 = (int)((ulong)in_stack_ffffffffffffefb0 >> 0x20);
  if (pcVar4 == (char *)0x0) {
    std::__cxx11::stringstream::stringstream(local_480);
    std::operator<<(&local_470,"inet_ntop");
    piVar3 = __errno_location();
    pcVar4 = strerror_r(*piVar3,local_588,0x100);
    if (pcVar4 == (char *)0x0) {
      poVar5 = std::operator<<(&local_470,"errno = ");
      std::operator<<(poVar5,local_588);
    }
    else {
      std::operator<<(&local_470,"errno = unknown");
    }
    local_5a9 = 1;
    uVar6 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_ffffffffffffefc0,
               (char *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),iVar2,
               in_stack_ffffffffffffefa8);
    local_5a9 = 0;
    __cxa_throw(uVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  iVar2 = getnameinfo(&local_2dc,0x10,local_9b8,0x401,local_9d8,0x20,2);
  plineNumber = (int)((ulong)in_stack_ffffffffffffefb0 >> 0x20);
  if (iVar2 != 0) {
    std::__cxx11::stringstream::stringstream(local_b60);
    poVar5 = std::operator<<(&local_b50,"getnameinfo(");
    poVar5 = std::operator<<(poVar5,local_2f8);
    std::operator<<(poVar5,")");
    piVar3 = __errno_location();
    pcVar4 = strerror_r(*piVar3,local_c68,0x100);
    if (pcVar4 == (char *)0x0) {
      poVar5 = std::operator<<(&local_b50,"errno = ");
      std::operator<<(poVar5,local_c68);
    }
    else {
      std::operator<<(&local_b50,"errno = unknown");
    }
    local_c89 = 1;
    uVar6 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_ffffffffffffefc0,
               (char *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),plineNumber,
               in_stack_ffffffffffffefa8);
    local_c89 = 0;
    __cxa_throw(uVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"connecting to ");
  poVar5 = std::operator<<(poVar5,local_2f8);
  poVar5 = std::operator<<(poVar5," = ");
  poVar5 = std::operator<<(poVar5,local_9b8);
  this = (vw_exception *)std::operator<<(poVar5,':');
  uVar1 = ntohs(local_8);
  this_00 = (void *)std::ostream::operator<<(this,uVar1);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_c98 = 0;
  while( true ) {
    iVar2 = (int)((ulong)in_stack_ffffffffffffefb0 >> 0x20);
    local_c9c = connect(local_c,&local_2dc,0x10);
    uVar7 = local_c9c == -1 && local_c98 < 100;
    if (local_c9c != -1 || local_c98 >= 100) break;
    local_c98 = local_c98 + 1;
    std::__cxx11::stringstream::stringstream(local_e28);
    in_stack_ffffffffffffefb0 = std::operator<<(&local_e18,"connect attempt ");
    in_stack_ffffffffffffefa8 =
         (string *)std::ostream::operator<<(in_stack_ffffffffffffefb0,local_c98);
    poVar5 = std::operator<<((ostream *)in_stack_ffffffffffffefa8," failed: ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar5,pcVar4);
    std::__cxx11::stringstream::str();
    poVar5 = std::operator<<((ostream *)&std::cerr,local_e48);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_e48);
    sleep(1);
    std::__cxx11::stringstream::~stringstream(local_e28);
  }
  if (local_c9c == -1) {
    std::__cxx11::stringstream::stringstream(local_fd0);
    std::operator<<(&local_fc0,"cannot connect");
    uVar6 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (this,(char *)CONCAT17(uVar7,in_stack_ffffffffffffefb8),iVar2,
               in_stack_ffffffffffffefa8);
    __cxa_throw(uVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  return local_c;
}

Assistant:

socket_t sock_connect(const uint32_t ip, const int port)
{
  socket_t sock = socket(PF_INET, SOCK_STREAM, 0);
  if (sock == -1)
    THROWERRNO("socket");

  sockaddr_in far_end;
  far_end.sin_family = AF_INET;
  far_end.sin_port = port;

  far_end.sin_addr = *(in_addr*)&ip;
  memset(&far_end.sin_zero, '\0', 8);

  {
    char dotted_quad[INET_ADDRSTRLEN];
    if (nullptr == inet_ntop(AF_INET, &(far_end.sin_addr), dotted_quad, INET_ADDRSTRLEN))
      THROWERRNO("inet_ntop");

    char hostname[NI_MAXHOST];
    char servInfo[NI_MAXSERV];
    if (getnameinfo((sockaddr*)&far_end, sizeof(sockaddr), hostname, NI_MAXHOST, servInfo, NI_MAXSERV, NI_NUMERICSERV))
      THROWERRNO("getnameinfo(" << dotted_quad << ")");

    cerr << "connecting to " << dotted_quad << " = " << hostname << ':' << ntohs(port) << endl;
  }

  size_t count = 0;
  int ret;
  while ((ret = connect(sock, (sockaddr*)&far_end, sizeof(far_end))) == -1 && count < 100)
  {
    count++;
    stringstream msg;
    msg << "connect attempt " << count << " failed: " << strerror(errno);
    cerr << msg.str() << endl;
#ifdef _WIN32
    Sleep(1);
#else
    sleep(1);
#endif
  }
  if (ret == -1)
    THROW("cannot connect");
  return sock;
}